

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.h
# Opt level: O3

void __thiscall
CVmObjStringBuffer::adjust_args(CVmObjStringBuffer *this,int32_t *idx,int32_t *len,int32_t *ins)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  
  piVar1 = (int *)(this->super_CVmObject).ext_;
  iVar3 = *idx;
  if (iVar3 < 0) {
    iVar2 = 0;
LAB_0027fccb:
    iVar3 = iVar2;
    *idx = iVar3;
  }
  else {
    iVar2 = *piVar1;
    if (iVar2 < iVar3) goto LAB_0027fccb;
  }
  if (len != (int32_t *)0x0) {
    if (*len < 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = *piVar1;
      if (*len + iVar3 <= iVar2) goto LAB_0027fcec;
      iVar2 = iVar2 - iVar3;
    }
    *len = iVar2;
  }
LAB_0027fcec:
  if ((ins != (int32_t *)0x0) && (*ins < 0)) {
    *ins = 0;
    return;
  }
  return;
}

Assistant:

vm_strbuf_ext *get_ext() const { return (vm_strbuf_ext *)ext_; }